

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_validator_options.cpp
# Opt level: O2

bool spvParseUniversalLimitsOptions(char *s,spv_validator_limit *type)

{
  bool bVar1;
  spv_validator_limit sVar2;
  anon_class_8_1_54a39813 match;
  
  match.s = s;
  bVar1 = spvParseUniversalLimitsOptions::anon_class_8_1_54a39813::operator()
                    (&match,"--max-struct-members");
  sVar2 = spv_validator_limit_max_struct_members;
  if (!bVar1) {
    bVar1 = spvParseUniversalLimitsOptions::anon_class_8_1_54a39813::operator()
                      (&match,"--max-struct_depth");
    if (bVar1) {
      sVar2 = spv_validator_limit_max_struct_depth;
    }
    else {
      bVar1 = spvParseUniversalLimitsOptions::anon_class_8_1_54a39813::operator()
                        (&match,"--max-local-variables");
      if (bVar1) {
        sVar2 = spv_validator_limit_max_local_variables;
      }
      else {
        bVar1 = spvParseUniversalLimitsOptions::anon_class_8_1_54a39813::operator()
                          (&match,"--max-global-variables");
        sVar2 = spv_validator_limit_max_global_variables;
        if ((!bVar1) &&
           (bVar1 = spvParseUniversalLimitsOptions::anon_class_8_1_54a39813::operator()
                              (&match,"--max-switch-branches"), !bVar1)) {
          bVar1 = spvParseUniversalLimitsOptions::anon_class_8_1_54a39813::operator()
                            (&match,"--max-function-args");
          if (bVar1) {
            sVar2 = spv_validator_limit_max_function_args;
          }
          else {
            bVar1 = spvParseUniversalLimitsOptions::anon_class_8_1_54a39813::operator()
                              (&match,"--max-control-flow-nesting-depth");
            if (bVar1) {
              sVar2 = spv_validator_limit_max_control_flow_nesting_depth;
            }
            else {
              bVar1 = spvParseUniversalLimitsOptions::anon_class_8_1_54a39813::operator()
                                (&match,"--max-access-chain-indexes");
              if (bVar1) {
                sVar2 = spv_validator_limit_max_access_chain_indexes;
              }
              else {
                bVar1 = spvParseUniversalLimitsOptions::anon_class_8_1_54a39813::operator()
                                  (&match,"--max-id-bound");
                if (!bVar1) {
                  return false;
                }
                sVar2 = spv_validator_limit_max_id_bound;
              }
            }
          }
        }
      }
    }
  }
  *type = sVar2;
  return true;
}

Assistant:

bool spvParseUniversalLimitsOptions(const char* s, spv_validator_limit* type) {
  auto match = [s](const char* b) {
    return s && (0 == strncmp(s, b, strlen(b)));
  };
  if (match("--max-struct-members")) {
    *type = spv_validator_limit_max_struct_members;
  } else if (match("--max-struct_depth")) {
    *type = spv_validator_limit_max_struct_depth;
  } else if (match("--max-local-variables")) {
    *type = spv_validator_limit_max_local_variables;
  } else if (match("--max-global-variables")) {
    *type = spv_validator_limit_max_global_variables;
  } else if (match("--max-switch-branches")) {
    *type = spv_validator_limit_max_global_variables;
  } else if (match("--max-function-args")) {
    *type = spv_validator_limit_max_function_args;
  } else if (match("--max-control-flow-nesting-depth")) {
    *type = spv_validator_limit_max_control_flow_nesting_depth;
  } else if (match("--max-access-chain-indexes")) {
    *type = spv_validator_limit_max_access_chain_indexes;
  } else if (match("--max-id-bound")) {
    *type = spv_validator_limit_max_id_bound;
  } else {
    // The command line option for this validator limit has not been added.
    // Therefore we return false.
    return false;
  }

  return true;
}